

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O3

void Abc_FlowRetime_SimulateSop(Abc_Obj_t *pObj,char *pSop)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  char *pcVar6;
  byte bVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  
  if ((pSop == (char *)0x0) || (iVar4 = Abc_SopIsExorType(pSop), iVar4 != 0)) {
    __assert_fail("pSop && !Abc_SopIsExorType(pSop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x1ba,"void Abc_FlowRetime_SimulateSop(Abc_Obj_t *, char *)");
  }
  iVar4 = Abc_SopGetVarNum(pSop);
  bVar9 = *pSop;
  if (bVar9 == 0) {
    bVar1 = true;
    bVar5 = false;
  }
  else {
    bVar1 = false;
    bVar5 = false;
    pcVar6 = pSop;
    do {
      lVar8 = 0;
      bVar7 = 1;
      bVar2 = false;
      while ((bVar9 & 0xdf) != 0) {
        if (bVar9 == 0x30) {
          iVar10 = 5;
LAB_004dc95b:
          if ((*(ushort *)
                (pManMR->pDataArray +
                *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar8]] + 0x10)) &
              0x60) == 0) {
            bVar2 = true;
          }
          else {
            bVar7 = bVar7 & (*(ushort *)
                              (pManMR->pDataArray +
                              *(uint *)((long)pObj->pNtk->vObjs->pArray
                                              [(pObj->vFanins).pArray[lVar8]] + 0x10)) >> iVar10 & 1
                            ) != 0;
          }
        }
        else if (bVar9 == 0x31) {
          iVar10 = 6;
          goto LAB_004dc95b;
        }
        lVar3 = lVar8 + 1;
        lVar8 = lVar8 + 1;
        bVar9 = pcVar6[lVar3];
      }
      if (bVar2 && bVar7 != 0) {
        bVar7 = 0;
        bVar1 = true;
      }
      bVar5 = (bool)(bVar5 | bVar7);
      bVar9 = pcVar6[iVar4 + 3];
      pcVar6 = pcVar6 + (iVar4 + 3);
    } while (bVar9 != 0);
    bVar1 = !bVar1;
  }
  iVar4 = Abc_SopGetPhase(pSop);
  *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
       *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xff9f;
  if ((bool)(bVar5 != false | bVar1)) {
    *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
         *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) |
         (ushort)(bVar5 != (iVar4 == 0)) * 0x20 + 0x20;
  }
  return;
}

Assistant:

void Abc_FlowRetime_SimulateSop( Abc_Obj_t * pObj, char *pSop ) {
  Abc_Obj_t * pFanin;
  char *pCube;
  int i, j, rAnd, rOr, rVar, dcAnd, dcOr, v;

  assert( pSop && !Abc_SopIsExorType(pSop) );
      
  rOr = 0, dcOr = 0;

  i = Abc_SopGetVarNum(pSop);
  Abc_SopForEachCube( pSop, i, pCube ) {
    rAnd = 1, dcAnd = 0;
    Abc_CubeForEachVar( pCube, v, j ) {
      pFanin = Abc_ObjFanin(pObj, j);
      if ( v == '0' )
        rVar = FTEST(pFanin, INIT_0) ? 1 : 0;
      else if ( v == '1' )
        rVar = FTEST(pFanin, INIT_1) ? 1 : 0;
      else
        continue;
      
      if (FTEST(pFanin, INIT_CARE))
        rAnd &= rVar;
      else
        dcAnd = 1;
    }
    if (!rAnd) dcAnd = 0; /* controlling value */
    if (dcAnd) 
      dcOr = 1;
    else
      rOr |= rAnd;
  }
  if (rOr) dcOr = 0; /* controlling value */
  
  // complement the result if necessary
  if ( !Abc_SopGetPhase(pSop) )
    rOr ^= 1;
      
  Abc_FlowRetime_SetInitValue(pObj, rOr, dcOr);
}